

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

int __thiscall ncnn::Convolution1D::load_model(Convolution1D *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_ffffffffffffff30;
  Mat *m;
  Mat *this_00;
  Mat local_b8;
  Mat local_60;
  long *local_18;
  int local_4;
  
  if (*(int *)(in_RDI + 0x140) == 0) {
    this_00 = &local_60;
    local_18 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(this_00,in_RSI,*(undefined4 *)(in_RDI + 0xf0),0);
    ncnn::Mat::operator=(this_00,in_stack_ffffffffffffff30);
    ncnn::Mat::~Mat((Mat *)0x90a707);
    bVar1 = ncnn::Mat::empty(in_stack_ffffffffffffff30);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      if (*(int *)(in_RDI + 0xec) != 0) {
        m = &local_b8;
        (**(code **)(*local_18 + 0x10))(m,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
        ncnn::Mat::operator=(this_00,m);
        ncnn::Mat::~Mat((Mat *)0x90a7aa);
        bVar1 = ncnn::Mat::empty(m);
        if (bVar1) {
          return -100;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Convolution1D::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}